

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmTarget * __thiscall
cmMakefile::AddUtilityCommand
          (cmMakefile *this,string *utilityName,bool excludeFromAll,
          unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc)

{
  bool bVar1;
  PolicyStatus cmp0116;
  pointer pcVar2;
  anon_class_16_2_5459418c local_60;
  cmMakefile *local_50;
  cmTarget *target;
  cmCustomCommandLines *commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc_local;
  string *psStack_20;
  bool excludeFromAll_local;
  string *utilityName_local;
  cmMakefile *this_local;
  
  depends = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)cc;
  cc_local._7_1_ = excludeFromAll;
  psStack_20 = utilityName;
  utilityName_local = (string *)this;
  pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  byproducts = cmCustomCommand::GetDepends_abi_cxx11_(pcVar2);
  pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  commandLines = (cmCustomCommandLines *)cmCustomCommand::GetByproducts_abi_cxx11_(pcVar2);
  pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  target = (cmTarget *)cmCustomCommand::GetCommandLines(pcVar2);
  local_50 = (cmMakefile *)AddNewUtilityTarget(this,psStack_20,(bool)(cc_local._7_1_ & 1));
  bVar1 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::empty
                    ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)target);
  if (((bVar1) &&
      (bVar1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::empty(byproducts), bVar1)) ||
     (bVar1 = ValidateCustomCommand(this,(cmCustomCommandLines *)target), !bVar1)) {
    this_local = local_50;
  }
  else {
    CreateGeneratedOutputs
              (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)commandLines);
    pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc)
    ;
    cmp0116 = GetPolicyStatus(this,CMP0116,false);
    cmCustomCommand::SetCMP0116Status(pcVar2,cmp0116);
    local_60.target = (cmTarget *)local_50;
    local_60.this = this;
    AddGeneratorAction<std::unique_ptr<cmCustomCommand,std::default_delete<cmCustomCommand>>,cmMakefile::AddUtilityCommand(std::__cxx11::string_const&,bool,std::unique_ptr<cmCustomCommand,std::default_delete<cmCustomCommand>>)::__0>
              (this,cc,&local_60);
    this_local = local_50;
  }
  return (cmTarget *)this_local;
}

Assistant:

cmTarget* cmMakefile::AddUtilityCommand(const std::string& utilityName,
                                        bool excludeFromAll,
                                        std::unique_ptr<cmCustomCommand> cc)
{
  const auto& depends = cc->GetDepends();
  const auto& byproducts = cc->GetByproducts();
  const auto& commandLines = cc->GetCommandLines();
  cmTarget* target = this->AddNewUtilityTarget(utilityName, excludeFromAll);

  // Validate custom commands.
  if ((commandLines.empty() && depends.empty()) ||
      !this->ValidateCustomCommand(commandLines)) {
    return target;
  }

  // Always create the byproduct sources and mark them generated.
  this->CreateGeneratedOutputs(byproducts);

  cc->SetCMP0116Status(this->GetPolicyStatus(cmPolicies::CMP0116));

  // Dispatch command creation to allow generator expressions in outputs.
  this->AddGeneratorAction(
    std::move(cc),
    [=](cmLocalGenerator& lg, const cmListFileBacktrace& lfbt,
        std::unique_ptr<cmCustomCommand> tcc) {
      BacktraceGuard guard(this->Backtrace, lfbt);
      tcc->SetBacktrace(lfbt);
      detail::AddUtilityCommand(lg, cmCommandOrigin::Project, target,
                                std::move(tcc));
    });

  return target;
}